

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrUtils-CPConv_IConv.c
# Opt level: O0

UINT8 CPConv_Init(CPCONV **retCPC,char *cpFrom,char *cpTo)

{
  CPCONV *__ptr;
  char *pcVar1;
  iconv_t pvVar2;
  size_t sVar3;
  CPCONV *cpc;
  char *cpTo_local;
  char *cpFrom_local;
  CPCONV **retCPC_local;
  
  __ptr = (CPCONV *)calloc(1,0x28);
  if (__ptr == (CPCONV *)0x0) {
    retCPC_local._7_1_ = 0xff;
  }
  else {
    pcVar1 = strdup(cpFrom);
    __ptr->cpFrom = pcVar1;
    pcVar1 = strdup(cpTo);
    __ptr->cpTo = pcVar1;
    pvVar2 = iconv_open(__ptr->cpTo,__ptr->cpFrom);
    __ptr->hIConv = pvVar2;
    if (__ptr->hIConv == (iconv_t)0xffffffffffffffff) {
      free(__ptr->cpFrom);
      free(__ptr->cpTo);
      free(__ptr);
      retCPC_local._7_1_ = 0x80;
    }
    else {
      sVar3 = GetEncodingCharSize(__ptr->cpFrom);
      __ptr->cpfCharSize = sVar3;
      sVar3 = GetEncodingCharSize(__ptr->cpTo);
      __ptr->cptCharSize = sVar3;
      *retCPC = __ptr;
      retCPC_local._7_1_ = '\0';
    }
  }
  return retCPC_local._7_1_;
}

Assistant:

UINT8 CPConv_Init(CPCONV** retCPC, const char* cpFrom, const char* cpTo)
{
	CPCONV* cpc;
	
	cpc = (CPCONV*)calloc(1, sizeof(CPCONV));
	if (cpc == NULL)
		return 0xFF;
	
	cpc->cpFrom = strdup(cpFrom);
	cpc->cpTo = strdup(cpTo);
	cpc->hIConv = iconv_open(cpc->cpTo, cpc->cpFrom);
	if (cpc->hIConv == (iconv_t)-1)
	{
		free(cpc->cpFrom);
		free(cpc->cpTo);
		free(cpc);
		return 0x80;
	}
	cpc->cpfCharSize = GetEncodingCharSize(cpc->cpFrom);
	cpc->cptCharSize = GetEncodingCharSize(cpc->cpTo);
	
	*retCPC = cpc;
	return 0x00;
}